

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O1

void __thiscall Parser::parse_subroutine_call(Parser *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  pointer pcVar4;
  VM_Writer *pVVar5;
  int iVar6;
  long *plVar7;
  ostream *poVar8;
  size_type *psVar9;
  string method_name_1;
  string method_name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  Tokenizer::get_current_token_abi_cxx11_(&local_70,this->tokenizer);
  iVar6 = std::__cxx11::string::compare((char *)&local_70);
  paVar1 = &local_70.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  local_70._M_dataplus._M_p = (pointer)paVar1;
  if (iVar6 == 0) {
    pcVar4 = (this->prev_token)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_70,pcVar4,pcVar4 + (this->prev_token)._M_string_length);
    poVar8 = (ostream *)this->out_file;
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\t\t\t\t\t<symbol>.</symbol>",0x17);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
    std::ostream::put((char)poVar8);
    std::ostream::flush();
    query_tokenizer(this);
    paVar1 = &local_90.field_2;
    local_90._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"IDENTIFIER","");
    paVar2 = &local_b0.field_2;
    local_b0._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,".","");
    check_token_type_x_after_y(this,&local_90,&local_b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != paVar2) {
      operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != paVar1) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
    poVar8 = (ostream *)this->out_file;
    std::operator+(&local_b0,"\t\t\t\t\t<identifier>",&this->cur_token);
    plVar7 = (long *)std::__cxx11::string::append((char *)&local_b0);
    psVar9 = (size_type *)(plVar7 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar7 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar9) {
      local_90.field_2._M_allocated_capacity = *psVar9;
      local_90.field_2._8_8_ = plVar7[3];
      local_90._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_90.field_2._M_allocated_capacity = *psVar9;
      local_90._M_dataplus._M_p = (pointer)*plVar7;
    }
    local_90._M_string_length = plVar7[1];
    *plVar7 = (long)psVar9;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar8,local_90._M_dataplus._M_p,local_90._M_string_length);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
    std::ostream::put((char)poVar8);
    std::ostream::flush();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != paVar1) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != paVar2) {
      operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
    }
    pcVar4 = (this->cur_token)._M_dataplus._M_p;
    local_90._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_90,pcVar4,pcVar4 + (this->cur_token)._M_string_length);
    query_tokenizer(this);
    local_b0._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"(","");
    paVar3 = &local_50.field_2;
    local_50._M_dataplus._M_p = (pointer)paVar3;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,".","");
    check_expected_x_after_y(this,&local_b0,&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != paVar3) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != paVar2) {
      operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
    }
    poVar8 = (ostream *)this->out_file;
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\t\t\t\t\t<symbol>(</symbol>",0x17);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
    std::ostream::put((char)poVar8);
    std::ostream::flush();
    query_tokenizer(this);
    iVar6 = std::__cxx11::string::compare((char *)&this->cur_token);
    if (iVar6 == 0) {
      poVar8 = (ostream *)this->out_file;
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\t\t\t\t\t<symbol>)</symbol>",0x17)
      ;
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
      std::ostream::put((char)poVar8);
      std::ostream::flush();
      query_tokenizer(this);
    }
    else {
      parse_expression_list(this);
      pVVar5 = this->vm_writer;
      local_50._M_dataplus._M_p = (pointer)paVar3;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_50,local_70._M_dataplus._M_p,
                 local_70._M_dataplus._M_p + local_70._M_string_length);
      std::__cxx11::string::append((char *)&local_50);
      plVar7 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&local_50,(ulong)local_90._M_dataplus._M_p);
      psVar9 = (size_type *)(plVar7 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar7 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar9) {
        local_b0.field_2._M_allocated_capacity = *psVar9;
        local_b0.field_2._8_8_ = plVar7[3];
        local_b0._M_dataplus._M_p = (pointer)paVar2;
      }
      else {
        local_b0.field_2._M_allocated_capacity = *psVar9;
        local_b0._M_dataplus._M_p = (pointer)*plVar7;
      }
      local_b0._M_string_length = plVar7[1];
      *plVar7 = (long)psVar9;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      iVar6 = Symbol_Table::get_temp_arg_count(&this->symbol_table);
      VM_Writer::write_call(pVVar5,&local_b0,iVar6);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != paVar2) {
        operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != paVar3) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != paVar1) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p == &local_70.field_2) {
      return;
    }
  }
  else {
    iVar6 = std::__cxx11::string::compare((char *)&this->cur_token);
    if (iVar6 != 0) {
      return;
    }
    pcVar4 = (this->prev_token)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_70,pcVar4,pcVar4 + (this->prev_token)._M_string_length);
    poVar8 = (ostream *)this->out_file;
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\t\t\t\t\t<symbol>(</symbol>",0x17);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
    std::ostream::put((char)poVar8);
    std::ostream::flush();
    query_tokenizer(this);
    iVar6 = std::__cxx11::string::compare((char *)&this->cur_token);
    if (iVar6 == 0) {
      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,")","");
      local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"(","");
      check_expected_x_after_y(this,&local_90,&local_b0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
      }
      poVar8 = (ostream *)this->out_file;
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\t\t\t\t\t<symbol>)</symbol>",0x17)
      ;
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
      std::ostream::put((char)poVar8);
      std::ostream::flush();
      query_tokenizer(this);
    }
    else {
      parse_expression_list(this);
      pVVar5 = this->vm_writer;
      iVar6 = Symbol_Table::get_arg_count(&this->symbol_table,&local_70);
      VM_Writer::write_call(pVVar5,&local_70,iVar6 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p == paVar1) {
      return;
    }
  }
  operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  return;
}

Assistant:

void Parser::parse_subroutine_call() {
    // only to be called once we know Tokenizer::type() == "IDENTIFIER"

    if (tokenizer.get_current_token() == ".") {
        std::string type_name = prev_token;
        out_file << "\t\t\t\t\t<symbol>.</symbol>" << std::endl;
        query_tokenizer();

        check_token_type_x_after_y("IDENTIFIER", ".");
        out_file << "\t\t\t\t\t<identifier>" + cur_token + "</identifier>" << std::endl;
        std::string method_name = cur_token;
        query_tokenizer();

        check_expected_x_after_y("(", ".");
        out_file << "\t\t\t\t\t<symbol>(</symbol>" << std::endl;
        query_tokenizer();

        if (cur_token != ")") {
            parse_expression_list();
            vm_writer.write_call(type_name + "." + method_name, symbol_table.get_temp_arg_count());
        }
        else {
            out_file << "\t\t\t\t\t<symbol>)</symbol>" << std::endl;
            query_tokenizer();
        }
    }
    else if (cur_token == "(") {
        std::string method_name = prev_token;
        out_file << "\t\t\t\t\t<symbol>(</symbol>" << std::endl;
        query_tokenizer();

        if (cur_token != ")") {
            parse_expression_list();
            vm_writer.write_call(method_name, symbol_table.get_arg_count(method_name) + 1);
        }
        else {
            check_expected_x_after_y(")", "(");
            out_file << "\t\t\t\t\t<symbol>)</symbol>" << std::endl;
            query_tokenizer();
        }
    }
}